

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O2

size_t ZSTD_freeCCtxParams(ZSTD_CCtx_params *params)

{
  if (params != (ZSTD_CCtx_params *)0x0) {
    ZSTD_customFree(params,params->customMem);
  }
  return 0;
}

Assistant:

size_t ZSTD_freeCCtxParams(ZSTD_CCtx_params* params)
{
    if (params == NULL) { return 0; }
    ZSTD_customFree(params, params->customMem);
    return 0;
}